

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool PrngTest<Blob<224>>(hashfunc<Blob<224>_> hash,bool testColl,bool testDist,bool drawDiagram)

{
  byte bVar1;
  bool bVar2;
  byte in_CL;
  byte bVar3;
  byte in_DL;
  byte bVar4;
  byte in_SIL;
  pfHash in_RDI;
  int unaff_retaddr;
  bool result;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  bool in_stack_000000bb;
  bool in_stack_000000bc;
  bool in_stack_000000bd;
  bool in_stack_000000be;
  bool in_stack_000000bf;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_000000c0;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffffd0;
  undefined5 in_stack_fffffffffffffff0;
  
  bVar4 = in_SIL & 1;
  bVar3 = in_DL & 1;
  bVar1 = in_CL & 1;
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x18bd23);
  hashfunc::operator_cast_to_function_pointer((hashfunc *)&stack0xfffffffffffffff8);
  Prn_gen<Blob<224>>(unaff_retaddr,in_RDI,
                     (vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
                     CONCAT17(bVar4,CONCAT16(bVar3,CONCAT15(bVar1,in_stack_fffffffffffffff0))));
  bVar2 = TestHashList<Blob<224>>
                    (in_stack_000000c0,in_stack_000000bf,in_stack_000000be,in_stack_000000bd,
                     in_stack_000000bc,in_stack_000000bb);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector(in_stack_ffffffffffffffd0);
  return bVar2;
}

Assistant:

bool PrngTest ( hashfunc<hashtype> hash,
                bool testColl, bool testDist, bool drawDiagram )
{

  if (sizeof(hashtype) < 8) {
      printf("The PRNG test is designed for hashes >= 64-bit \n");
      return true;
  }

  //----------

  std::vector<hashtype> hashes;
  Prn_gen(32 << 20, hash, hashes);

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  return result;
}